

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_log_helper.h
# Opt level: O0

void spdlog::details::async_log_helper::sleep_or_yield(time_point *now,time_point *last_op_time)

{
  bool bVar1;
  int local_4c;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  int local_3c;
  duration<long,_std::ratio<1L,_1000000L>_> local_38;
  int local_2c;
  duration<long,_std::ratio<1L,_1000000L>_> local_28;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  type time_since_op;
  time_point *last_op_time_local;
  time_point *now_local;
  
  time_since_op.__r = (rep)last_op_time;
  local_20.__r = (rep)std::chrono::operator-(now,last_op_time);
  local_2c = 0x32;
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000000l>> *)&local_28,&local_2c);
  bVar1 = std::chrono::operator<=(&local_20,&local_28);
  if (!bVar1) {
    local_3c = 100;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000000l>> *)&local_38,&local_3c);
    bVar1 = std::chrono::operator<=(&local_20,&local_38);
    if (bVar1) {
      std::this_thread::yield();
    }
    else {
      local_4c = 200;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_48,&local_4c);
      bVar1 = std::chrono::operator<=(&local_20,&local_48);
      if (bVar1) {
        os::sleep_for_millis(0x14);
      }
      else {
        os::sleep_for_millis(500);
      }
    }
  }
  return;
}

Assistant:

inline void spdlog::details::async_log_helper::sleep_or_yield(
    const spdlog::log_clock::time_point &now, const spdlog::log_clock::time_point &last_op_time)
{
    using std::chrono::microseconds;
    using std::chrono::milliseconds;

    auto time_since_op = now - last_op_time;

    // spin upto 50 micros
    if (time_since_op <= microseconds(50))
    {
        return;
    }

    // yield upto 150 micros
    if (time_since_op <= microseconds(100))
    {
        return std::this_thread::yield();
    }

    // sleep for 20 ms upto 200 ms
    if (time_since_op <= milliseconds(200))
    {
        return details::os::sleep_for_millis(20);
    }

    // sleep for 500 ms
    return details::os::sleep_for_millis(500);
}